

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

bool __thiscall Lexer::isPath(Lexer *this,string *token,Type *type)

{
  size_t sVar1;
  char cVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  size_t marker;
  size_t local_50;
  string local_48 [32];
  
  iVar5 = 0;
  if (this->_enablePath == true) {
    local_50 = this->_cursor;
LAB_001051a4:
    pcVar3 = (this->_text)._M_dataplus._M_p;
    if (pcVar3[local_50] == '/') {
      sVar1 = local_50 + 1;
      iVar5 = iVar5 + 1;
      cVar2 = pcVar3[local_50 + 1];
      local_50 = sVar1;
      if (((cVar2 == '\0') || (bVar4 = unicodeWhitespace((int)cVar2), bVar4)) ||
         ((this->_text)._M_dataplus._M_p[local_50] == '/')) goto LAB_0010520f;
      do {
        utf8_next_char(&this->_text,&local_50);
        cVar2 = (this->_text)._M_dataplus._M_p[local_50];
        if ((cVar2 == '\0') || (bVar4 = unicodeWhitespace((int)cVar2), bVar4)) break;
      } while ((this->_text)._M_dataplus._M_p[local_50] != '/');
      goto LAB_001051a4;
    }
LAB_0010520f:
    if (this->_cursor < local_50 && 3 < iVar5) {
      *type = path;
      std::__cxx11::string::substr((ulong)local_48,(ulong)this);
      std::__cxx11::string::operator=((string *)token,local_48);
      std::__cxx11::string::~string(local_48);
      this->_cursor = local_50;
      iVar5 = 1;
    }
    else {
      iVar5 = 0;
    }
  }
  return SUB41(iVar5,0);
}

Assistant:

bool Lexer::isPath (std::string& token, Lexer::Type& type)
{
  if (_enablePath)
  {
    std::size_t marker = _cursor;
    int slashCount = 0;

    while (1)
    {
      if (_text[marker] == '/')
      {
        ++marker;
        ++slashCount;
      }
      else
        break;

      if (_text[marker] &&
          ! unicodeWhitespace (_text[marker]) &&
          _text[marker] != '/')
      {
        utf8_next_char (_text, marker);
        while (_text[marker] &&
               ! unicodeWhitespace (_text[marker]) &&
               _text[marker] != '/')
          utf8_next_char (_text, marker);
      }
      else
        break;
    }

    if (marker > _cursor &&
        slashCount > 3)
    {
      type = Lexer::Type::path;
      token = _text.substr (_cursor, marker - _cursor);
      _cursor = marker;
      return true;
    }
  }

  return false;
}